

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O3

double __thiscall w3Module::read_f64(w3Module *this,uint8_t **cursor)

{
  uint8_t uVar1;
  uint32_t i;
  long lVar2;
  anon_union_8_2_095b82ba u;
  double local_20;
  
  lVar2 = 0;
  do {
    uVar1 = ::read_byte(cursor,this->end);
    *(uint8_t *)((long)&local_20 + lVar2) = uVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return local_20;
}

Assistant:

double w3Module::read_f64 (uint8_t** cursor)
// floats are not variably sized? Spec is unclear due to fancy notation
// getting in the way.
{
    union
    {
        uint8_t bytes [8];
        double f64;
    } u;
    for (uint32_t i = 0; i < 8; ++i)
        u.bytes [i] = (uint8_t)read_byte (cursor);
    return u.f64;
}